

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

bool slang::ast::SFormat::parse
               (string_view str,
               function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText,
               function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
               onArg,function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
                     onError)

{
  byte bVar1;
  byte *curr;
  optional<unsigned_int> oVar2;
  optional<unsigned_int> oVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  byte bVar7;
  _Optional_payload_base<char> spec;
  byte *pbVar8;
  byte *end;
  EVP_PKEY_CTX *ctx;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  anon_class_24_3_60222c9d err;
  SmallVector<char,_40UL> text;
  byte *local_d8;
  FormatOptions local_d0;
  char local_b9;
  intptr_t local_b8;
  _func_void_intptr_t_basic_string_view<char,_std::char_traits<char>_> *local_b0;
  _func_void_intptr_t_char_unsigned_long_unsigned_long_FormatOptions_ptr *local_a8;
  intptr_t local_a0;
  anon_class_24_3_60222c9d local_98;
  SmallVectorBase<char> local_80 [2];
  string_view local_40;
  
  local_b8 = onText.callable;
  local_b0 = onText.callback;
  local_a0 = onArg.callable;
  local_a8 = onArg.callback;
  local_d8 = (byte *)str._M_str;
  local_40._M_len = str._M_len;
  local_98.ptr = (char **)&local_d8;
  local_98.str = &local_40;
  local_80[0].data_ = local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 0x28;
  end = local_d8 + local_40._M_len;
  local_98.onError = &onError;
  local_40._M_str = (char *)local_d8;
LAB_00737859:
  oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (_Optional_base<unsigned_int,_true,_true>)local_d0.width;
  curr = local_d8;
  if (local_d8 == end) {
LAB_00737a97:
    bVar4 = true;
    ctx = (EVP_PKEY_CTX *)local_80[0].len;
    if ((EVP_PKEY_CTX *)local_80[0].len != (EVP_PKEY_CTX *)0x0) {
      bVar10._M_str = local_80[0].data_;
      bVar10._M_len = local_80[0].len;
      (*local_b0)(local_b8,bVar10);
    }
LAB_00737ac9:
    SmallVectorBase<char>::cleanup(local_80,ctx);
    return bVar4;
  }
  pbVar8 = local_d8 + 1;
  local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = *local_d8;
  oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (_Optional_base<unsigned_int,_true,_true>)local_d0.width;
  if (*local_d8 != 0x25) goto LAB_0073789c;
  if ((pbVar8 != end) && (*pbVar8 == 0x25)) {
    local_d8 = local_d8 + 2;
    local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = 0x25;
    SmallVectorBase<char>::emplace_back<char>(local_80,(char *)&local_d0);
    goto LAB_00737859;
  }
  bVar4 = false;
  local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._5_3_ =
       oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._5_3_;
  local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value =
       oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  local_d0.leftJustify = false;
  local_d0.zeroPad = false;
  bVar6 = false;
  for (; local_d8 = pbVar8, pbVar8 != end; pbVar8 = pbVar8 + 1) {
    bVar1 = *pbVar8;
    if (bVar1 == 0x30) {
      if (bVar6) goto LAB_007378fc;
      local_d0.zeroPad = true;
      bVar6 = true;
    }
    else {
      if (bVar1 != 0x2d) {
        if ((byte)(bVar1 - 0x30) < 10) {
LAB_007378fc:
          local_d0.width = parseUInt((char **)&local_d8,(char *)end);
          if (((ulong)local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) == 0)
          goto LAB_00737ae7;
        }
        break;
      }
      if (bVar4) break;
      local_d0.leftJustify = true;
      bVar4 = true;
    }
  }
  if ((local_d8 != end) && (*local_d8 == 0x2e)) {
    local_d8 = local_d8 + 1;
    if ((local_d8 == end) || (9 < (byte)(*local_d8 - 0x30))) {
      if (local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload = (_Storage<unsigned_int,_true>)0x0;
        local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = true;
      }
      local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           ((ulong)local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xffffffff00000000);
      goto LAB_0073797a;
    }
    local_d0.precision = parseUInt((char **)&local_d8,(char *)end);
    if (((ulong)local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) goto LAB_0073797a;
LAB_00737ae7:
    ctx = (EVP_PKEY_CTX *)((long)&__DT_RELA[0x1b8a].r_addend + 3);
    parse::anon_class_24_3_60222c9d::operator()
              (&local_98,(DiagCode)0x13000b,(char *)local_d8,(optional<char>)0x0);
    goto LAB_00737ac7;
  }
LAB_0073797a:
  if (local_d8 == end) {
    parse::anon_class_24_3_60222c9d::operator()
              (&local_98,(DiagCode)0x2f000b,(char *)curr,(optional<char>)0x0);
    local_b9 = '%';
    SmallVectorBase<char>::emplace_back<char>(local_80,&local_b9);
    goto LAB_00737a97;
  }
  bVar1 = *local_d8;
  local_d8 = local_d8 + 1;
  cVar5 = charToLower(bVar1);
  switch(cVar5) {
  case 'b':
  case 'd':
  case 'h':
  case 'o':
  case 'x':
    if (local_d0.zeroPad == true) {
      local_d0._16_2_ = local_d0._16_2_ & 0xff;
      if (local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload = (_Storage<unsigned_int,_true>)0x0;
        local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = true;
      }
    }
    goto LAB_007379de;
  case 'c':
  case 'l':
  case 'm':
  case 'p':
  case 'u':
  case 'v':
  case 'z':
    bVar7 = 1;
    bVar4 = false;
    break;
  case 'e':
  case 'f':
  case 'g':
    bVar4 = true;
    bVar7 = 0;
    break;
  default:
    spec = (_Optional_payload_base<char>)(bVar1 | 0x100);
    ctx = (EVP_PKEY_CTX *)0x2a000b;
    goto LAB_00737aba;
  case 's':
  case 't':
LAB_007379de:
    bVar7 = 1;
    bVar4 = true;
  }
  if (local_d0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false) {
    if (local_d0.leftJustify != true || bVar4) goto LAB_007379fb;
LAB_00737a60:
    spec = (_Optional_payload_base<char>)(bVar1 | 0x100);
    ctx = (EVP_PKEY_CTX *)((long)&__DT_RELA[0x30e0].r_offset + 3);
  }
  else {
    if (!bVar4) goto LAB_00737a60;
LAB_007379fb:
    if ((local_d0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged & bVar7) == 0) {
      if ((!bVar4 && local_d0.zeroPad == true) && cVar5 != 'p') goto LAB_00737a60;
      if ((EVP_PKEY_CTX *)local_80[0].len != (EVP_PKEY_CTX *)0x0) {
        bVar9._M_str = local_80[0].data_;
        bVar9._M_len = local_80[0].len;
        (*local_b0)(local_b8,bVar9);
        local_80[0].len = 0;
      }
      (*local_a8)(local_a0,bVar1,(long)curr - (long)local_40._M_str,(long)local_d8 - (long)curr,
                  &local_d0);
      goto LAB_00737859;
    }
    ctx = (EVP_PKEY_CTX *)((long)&__DT_RELA[0x2635].r_info + 3);
    spec._M_payload = (_Storage<char,_true>)0x0;
    spec._M_engaged = false;
  }
LAB_00737aba:
  parse::anon_class_24_3_60222c9d::operator()
            (&local_98,SUB84(ctx,0),(char *)curr,(optional<char>)spec);
LAB_00737ac7:
  bVar4 = false;
  goto LAB_00737ac9;
LAB_0073789c:
  local_d8 = pbVar8;
  SmallVectorBase<char>::emplace_back<char_const&>(local_80,(char *)&local_d0);
  goto LAB_00737859;
}

Assistant:

bool parse(std::string_view str, function_ref<void(std::string_view)> onText,
           function_ref<void(char, size_t, size_t, const FormatOptions&)> onArg,
           function_ref<void(DiagCode, size_t, size_t, std::optional<char>)> onError) {
    SmallVector<char> text;
    const char* ptr = str.data();
    const char* end = str.data() + str.length();

    auto err = [&](DiagCode code, const char* curr, std::optional<char> spec = {}) {
        onError(code, size_t(curr - str.data()), size_t(ptr - curr), spec);
    };

    while (ptr != end) {
        const char* start = ptr;
        if (char c = *ptr++; c != '%') {
            text.push_back(c);
            continue;
        }

        // %% collapses to a single %
        if (ptr != end && *ptr == '%') {
            ptr++;
            text.push_back('%');
            continue;
        }

        FormatOptions options;
        while (ptr != end) {
            if (*ptr == '-' && !options.leftJustify) {
                options.leftJustify = true;
                ptr++;
            }
            else if (*ptr == '0' && !options.zeroPad) {
                options.zeroPad = true;
                ptr++;
            }
            else {
                break;
            }
        }

        if (ptr != end && isDecimalDigit(*ptr)) {
            options.width = parseUInt(ptr, end);
            if (!options.width) {
                err(diag::FormatSpecifierInvalidWidth, ptr);
                return false;
            }
        }

        if (ptr != end && *ptr == '.') {
            ptr++;
            if (ptr != end && isDecimalDigit(*ptr)) {
                options.precision = parseUInt(ptr, end);
                if (!options.precision) {
                    err(diag::FormatSpecifierInvalidWidth, ptr);
                    return false;
                }
            }
            else {
                // Precision defaults to zero if we just have a decimal point.
                options.precision = 0;
            }
        }

        if (ptr == end) {
            err(diag::MissingFormatSpecifier, start);
            text.push_back('%');
            break;
        }

        bool widthAllowed = false;
        bool floatAllowed = false;
        char c = *ptr++;
        char spec = charToLower(c);
        switch (spec) {
            case 'h':
            case 'x':
            case 'd':
            case 'o':
            case 'b':
                widthAllowed = true;
                if (options.zeroPad) {
                    options.zeroPad = false;
                    if (!options.width)
                        options.width = 0;
                }
                break;
            case 'e':
            case 'f':
            case 'g':
                widthAllowed = true;
                floatAllowed = true;
                break;
            case 's':
            case 't':
                widthAllowed = true;
                break;
            case 'c':
            case 'u':
            case 'z':
            case 'v':
            case 'p':
            case 'l':
            case 'm':
                break;
            default:
                err(diag::UnknownFormatSpecifier, start, c);
                return false;
        }

        if ((options.width || options.leftJustify) && !widthAllowed) {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (options.precision && !floatAllowed) {
            err(diag::FormatSpecifierNotFloat, start);
            return false;
        }

        // Pattern args allow the zero-pad specifier.
        if (options.zeroPad && !widthAllowed && spec != 'p') {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (!text.empty()) {
            onText(toStringView(text));
            text.clear();
        }

        onArg(c, size_t(start - str.data()), size_t(ptr - start), options);
    }

    if (!text.empty())
        onText(toStringView(text));

    return true;
}